

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

bool line_tool_proc(Am_Object *param_1)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  undefined1 local_28 [8];
  Am_Value v;
  Am_Object *param_0_local;
  
  v.value = (anon_union_8_8_ea4c8939_for_value)param_1;
  Am_Value::Am_Value((Am_Value *)local_28);
  pAVar2 = Am_Object::Peek(&tool_panel,0x169,0);
  Am_Value::operator=((Am_Value *)local_28,(Am_Value *)pAVar2);
  if (local_28._0_2_ == 0xa001) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&line_bm);
    bVar1 = Am_Value::operator==((Am_Value *)local_28,pAVar3);
    if ((bVar1 & 1) != 0) {
      param_0_local._7_1_ = true;
      goto LAB_0010a376;
    }
  }
  param_0_local._7_1_ = false;
LAB_0010a376:
  Am_Value::~Am_Value((Am_Value *)local_28);
  return param_0_local._7_1_;
}

Assistant:

Am_Define_No_Self_Formula(bool, line_tool)
{
  Am_Value v;
  v = tool_panel.Peek(Am_VALUE);
  if (v.type == Am_OBJECT && v == line_bm)
    return true;
  else
    return false;
}